

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O0

int dwarf_close_str_offsets_table_access(Dwarf_Str_Offsets_Table table_data,Dwarf_Error *error)

{
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Str_Offsets_Table table_data_local;
  
  if (table_data == (Dwarf_Str_Offsets_Table)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x192);
    table_data_local._4_4_ = 1;
  }
  else if (table_data->so_dbg == (Dwarf_Debug)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x193);
    table_data_local._4_4_ = 1;
  }
  else if (table_data->so_magic_value == 0x2feed2) {
    table_data->so_magic_value = 0xdead;
    dwarf_dealloc(table_data->so_dbg,table_data,0x40);
    table_data_local._4_4_ = 0;
  }
  else {
    _dwarf_error(table_data->so_dbg,error,0x194);
    table_data_local._4_4_ = 1;
  }
  return table_data_local._4_4_;
}

Assistant:

int
dwarf_close_str_offsets_table_access(
    Dwarf_Str_Offsets_Table  table_data,
    Dwarf_Error             * error)
{
    Dwarf_Debug dbg = 0;

    VALIDATE_SOT(table_data)
    dbg = table_data->so_dbg;
    table_data->so_magic_value = 0xdead;
    dwarf_dealloc(dbg,table_data, DW_DLA_STR_OFFSETS);
    return DW_DLV_OK;
}